

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef getFPUSynonym(StringRef FPU)

{
  StringRef SVar1;
  bool bVar2;
  StringRef *pSVar3;
  StringLiteral local_11e0;
  char *local_11d0;
  StringLiteral local_11c0;
  StringLiteral local_11b0;
  char *local_11a0;
  StringLiteral local_1190;
  char *local_1180;
  StringLiteral local_1170;
  StringLiteral local_1160;
  char *local_1150;
  StringLiteral local_1140;
  StringLiteral local_1130;
  char *local_1120;
  StringLiteral local_1110;
  char *local_1100;
  StringLiteral local_10f0;
  char *local_10e0;
  StringLiteral local_10d0;
  char *local_10c0;
  StringLiteral local_10b0;
  char *local_10a0;
  StringLiteral local_1090;
  char *local_1080;
  StringLiteral local_1070;
  StringLiteral local_1060;
  StringLiteral local_1050;
  StringLiteral local_1040;
  char *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  Optional<llvm::StringRef> OStack_1010;
  char *local_ff8;
  StringRef FPU_local;
  StringRef local_ee8;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  char **local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  int local_e64;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  char **local_e40;
  StringRef local_e38;
  char *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  char **local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_dc0;
  int local_db4;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  char **local_d90;
  StringRef local_d88;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  char **local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  int local_d04;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char **local_ce0;
  StringRef local_cd8;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char **local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  int local_c54;
  char *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  char **local_c30;
  StringRef local_c28;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  char *local_be0;
  char **local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  int local_ba4;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  char **local_b80;
  StringRef local_b78;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char **local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  int local_af4;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char **local_ad0;
  StringRef local_ac8;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char **local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  int local_a44;
  char **local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  size_t local_9f0;
  char *local_9e8;
  size_t local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  size_t local_9a0;
  char *local_998;
  char *local_990;
  char **local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char **local_940;
  StringRef local_938;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char **local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  int local_8b4;
  char *local_8b0;
  size_t local_8a8;
  char *local_8a0;
  size_t local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  size_t local_878;
  char *local_870;
  char *local_868;
  char **local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char **local_818;
  StringRef local_810;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char **local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  int local_78c;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char **local_768;
  StringRef local_760;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char **local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  int local_6dc;
  char *local_6d8;
  size_t local_6d0;
  char *local_6c8;
  size_t local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  size_t local_6a0;
  char *local_698;
  char *local_690;
  char **local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char **local_640;
  StringRef local_638;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char **local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  int local_5b4;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char **local_590;
  StringRef local_588;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char **local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  int local_504;
  char *local_500;
  size_t local_4f8;
  char *local_4f0;
  size_t local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  size_t local_4c8;
  char *local_4c0;
  char *local_4b8;
  char **local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char **local_468;
  StringRef local_460;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char **local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  int local_3dc;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char **local_3b8;
  StringRef local_3b0;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char **local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  int local_32c;
  char *local_328;
  char *local_320;
  char *local_318;
  size_t local_310;
  char *local_308;
  size_t local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  size_t local_2d0;
  char *local_2c8;
  char *local_2c0;
  char **local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char **local_270;
  StringRef local_268;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char **local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  int local_1e4;
  char *local_1e0;
  size_t local_1d8;
  char *local_1d0;
  size_t local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  char *local_198;
  char **local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char **local_148;
  StringRef local_140;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char **local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  int local_bc;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char **local_98;
  StringRef local_90;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_1028 = (char *)FPU.Length;
  local_1030 = FPU.Data;
  local_ff8 = local_1030;
  FPU_local.Data = local_1028;
  local_1020 = local_1030;
  local_1018 = local_1028;
  llvm::Optional<llvm::StringRef>::Optional(&OStack_1010);
  llvm::StringLiteral::StringLiteral<4UL>(&local_1040,(char (*) [4])"fpa");
  llvm::StringLiteral::StringLiteral<5UL>(&local_1050,(char (*) [5])"fpe2");
  llvm::StringLiteral::StringLiteral<5UL>(&local_1060,(char (*) [5])"fpe3");
  llvm::StringLiteral::StringLiteral<9UL>(&local_1070,(char (*) [9])"maverick");
  local_1080 = "invalid";
  local_9f0 = strlen("invalid");
  local_9f8 = local_1080;
  local_a08 = local_1070.super_StringRef.Data;
  local_a00 = (char *)local_1070.super_StringRef.Length;
  local_a18 = local_1060.super_StringRef.Data;
  local_a10 = (char *)local_1060.super_StringRef.Length;
  local_970 = local_1040.super_StringRef.Data;
  local_968 = (char *)local_1040.super_StringRef.Length;
  local_980 = local_1050.super_StringRef.Data;
  local_978 = (char *)local_1050.super_StringRef.Length;
  local_998 = local_1040.super_StringRef.Data;
  local_990 = (char *)local_1040.super_StringRef.Length;
  local_9a8 = local_1080;
  local_928 = local_1040.super_StringRef.Data;
  local_920 = (char *)local_1040.super_StringRef.Length;
  local_938.Data = local_1080;
  local_9a0 = local_9f0;
  local_988 = &local_1020;
  local_940 = &local_1020;
  local_938.Length = local_9f0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_950 = local_1020;
    local_948 = local_1018;
    local_960 = local_928;
    local_958 = local_920;
    local_908 = local_928;
    local_900 = local_920;
    local_918 = local_928;
    local_910 = local_920;
    local_8e0 = local_928;
    local_8d8 = local_920;
    local_8e8 = &local_8f8;
    bVar2 = false;
    local_8f8 = local_950;
    local_8f0 = local_948;
    if (local_1018 == local_920) {
      local_8c0 = local_1020;
      local_8c8 = local_928;
      local_8d0 = local_920;
      if (local_920 == (char *)0x0) {
        local_8b4 = 0;
      }
      else {
        local_8b4 = memcmp(local_1020,local_928,(size_t)local_920);
      }
      bVar2 = local_8b4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_938);
    }
  }
  local_9b8 = local_980;
  local_9b0 = local_978;
  local_9c8 = local_a18;
  local_9c0 = local_a10;
  local_9d8 = local_a08;
  local_9d0 = local_a00;
  local_9e8 = local_9f8;
  local_9e0 = local_9f0;
  local_318 = local_9f8;
  local_310 = local_9f0;
  local_328 = local_a08;
  local_320 = local_a00;
  local_2a0 = local_980;
  local_298 = local_978;
  local_2b0 = local_a18;
  local_2a8 = local_a10;
  local_2c8 = local_980;
  local_2c0 = local_978;
  local_2d8 = local_9f8;
  local_2d0 = local_9f0;
  local_258 = local_980;
  local_250 = local_978;
  local_268.Data = local_9f8;
  local_268.Length = local_9f0;
  local_2b8 = &local_1020;
  local_270 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_280 = local_1020;
    local_278 = local_1018;
    local_290 = local_258;
    local_288 = local_250;
    local_238 = local_258;
    local_230 = local_250;
    local_248 = local_258;
    local_240 = local_250;
    local_210 = local_258;
    local_208 = local_250;
    local_218 = &local_228;
    bVar2 = false;
    local_228 = local_280;
    local_220 = local_278;
    if (local_1018 == local_250) {
      local_1f0 = local_1020;
      local_1f8 = local_258;
      local_200 = local_250;
      if (local_250 == (char *)0x0) {
        local_1e4 = 0;
      }
      else {
        local_1e4 = memcmp(local_1020,local_258,(size_t)local_250);
      }
      bVar2 = local_1e4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_268);
    }
  }
  local_2e8 = local_2b0;
  local_2e0 = local_2a8;
  local_2f8 = local_328;
  local_2f0 = local_320;
  local_308 = local_318;
  local_300 = local_310;
  local_1e0 = local_318;
  local_1d8 = local_310;
  local_178 = local_2b0;
  local_170 = local_2a8;
  local_188 = local_328;
  local_180 = local_320;
  local_1a0 = local_2b0;
  local_198 = local_2a8;
  local_1b0 = local_318;
  local_1a8 = local_310;
  local_80 = local_2b0;
  local_78 = local_2a8;
  local_90.Data = local_318;
  local_90.Length = local_310;
  local_190 = &local_1020;
  local_98 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_a8 = local_1020;
    local_a0 = local_1018;
    local_b8 = local_80;
    local_b0 = local_78;
    local_60 = local_80;
    local_58 = local_78;
    local_70 = local_80;
    local_68 = local_78;
    local_38 = local_80;
    local_30 = local_78;
    local_40 = &local_50;
    bVar2 = false;
    local_50 = local_a8;
    local_48 = local_a0;
    if (local_1018 == local_78) {
      local_18 = local_1020;
      local_20 = local_80;
      local_28 = local_78;
      if (local_78 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_1020,local_80,(size_t)local_78);
      }
      bVar2 = local_c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_90);
    }
  }
  local_1c0 = local_188;
  local_1b8 = local_180;
  local_1d0 = local_1e0;
  local_1c8 = local_1d8;
  local_130 = local_188;
  local_128 = local_180;
  local_140.Data = local_1e0;
  local_140.Length = local_1d8;
  local_148 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_158 = local_1020;
    local_150 = local_1018;
    local_168 = local_130;
    local_160 = local_128;
    local_110 = local_130;
    local_108 = local_128;
    local_120 = local_130;
    local_118 = local_128;
    local_e8 = local_130;
    local_e0 = local_128;
    local_f0 = &local_100;
    bVar2 = false;
    local_100 = local_158;
    local_f8 = local_150;
    if (local_1018 == local_128) {
      local_c8 = local_1020;
      local_d0 = local_130;
      local_d8 = local_128;
      if (local_128 == (char *)0x0) {
        local_bc = 0;
      }
      else {
        local_bc = memcmp(local_1020,local_130,(size_t)local_128);
      }
      bVar2 = local_bc == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_140);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_1090,(char (*) [5])0x2ee639);
  local_10a0 = "vfpv2";
  local_ac8.Length = strlen("vfpv2");
  local_ab8 = local_1090.super_StringRef.Data;
  local_ab0 = (char *)local_1090.super_StringRef.Length;
  local_ac8.Data = local_10a0;
  local_ad0 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_ae0 = local_1020;
    local_ad8 = local_1018;
    local_af0 = local_ab8;
    local_ae8 = local_ab0;
    local_a98 = local_ab8;
    local_a90 = local_ab0;
    local_aa8 = local_ab8;
    local_aa0 = local_ab0;
    local_a70 = local_ab8;
    local_a68 = local_ab0;
    local_a78 = &local_a88;
    bVar2 = false;
    local_a88 = local_ae0;
    local_a80 = local_ad8;
    if (local_1018 == local_ab0) {
      local_a50 = local_1020;
      local_a58 = local_ab8;
      local_a60 = local_ab0;
      if (local_ab0 == (char *)0x0) {
        local_a44 = 0;
      }
      else {
        local_a44 = memcmp(local_1020,local_ab8,(size_t)local_ab0);
      }
      bVar2 = local_a44 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_ac8);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_10b0,(char (*) [5])0x2ee627);
  local_10c0 = "vfpv3";
  local_b78.Length = strlen("vfpv3");
  local_b68 = local_10b0.super_StringRef.Data;
  local_b60 = (char *)local_10b0.super_StringRef.Length;
  local_b78.Data = local_10c0;
  local_b80 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_b90 = local_1020;
    local_b88 = local_1018;
    local_ba0 = local_b68;
    local_b98 = local_b60;
    local_b48 = local_b68;
    local_b40 = local_b60;
    local_b58 = local_b68;
    local_b50 = local_b60;
    local_b20 = local_b68;
    local_b18 = local_b60;
    local_b28 = &local_b38;
    bVar2 = false;
    local_b38 = local_b90;
    local_b30 = local_b88;
    if (local_1018 == local_b60) {
      local_b00 = local_1020;
      local_b08 = local_b68;
      local_b10 = local_b60;
      if (local_b60 == (char *)0x0) {
        local_af4 = 0;
      }
      else {
        local_af4 = memcmp(local_1020,local_b68,(size_t)local_b60);
      }
      bVar2 = local_af4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_b78);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_10d0,(char (*) [5])0x2ee621);
  local_10e0 = "vfpv4";
  local_c28.Length = strlen("vfpv4");
  local_c18 = local_10d0.super_StringRef.Data;
  local_c10 = (char *)local_10d0.super_StringRef.Length;
  local_c28.Data = local_10e0;
  local_c30 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_c40 = local_1020;
    local_c38 = local_1018;
    local_c50 = local_c18;
    local_c48 = local_c10;
    local_bf8 = local_c18;
    local_bf0 = local_c10;
    local_c08 = local_c18;
    local_c00 = local_c10;
    local_bd0 = local_c18;
    local_bc8 = local_c10;
    local_bd8 = &local_be8;
    bVar2 = false;
    local_be8 = local_c40;
    local_be0 = local_c38;
    if (local_1018 == local_c10) {
      local_bb0 = local_1020;
      local_bb8 = local_c18;
      local_bc0 = local_c10;
      if (local_c10 == (char *)0x0) {
        local_ba4 = 0;
      }
      else {
        local_ba4 = memcmp(local_1020,local_c18,(size_t)local_c10);
      }
      bVar2 = local_ba4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_c28);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_10f0,(char (*) [9])"vfp3-d16");
  local_1100 = "vfpv3-d16";
  local_cd8.Length = strlen("vfpv3-d16");
  local_cc8 = local_10f0.super_StringRef.Data;
  local_cc0 = (char *)local_10f0.super_StringRef.Length;
  local_cd8.Data = local_1100;
  local_ce0 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_cf0 = local_1020;
    local_ce8 = local_1018;
    local_d00 = local_cc8;
    local_cf8 = local_cc0;
    local_ca8 = local_cc8;
    local_ca0 = local_cc0;
    local_cb8 = local_cc8;
    local_cb0 = local_cc0;
    local_c80 = local_cc8;
    local_c78 = local_cc0;
    local_c88 = &local_c98;
    bVar2 = false;
    local_c98 = local_cf0;
    local_c90 = local_ce8;
    if (local_1018 == local_cc0) {
      local_c60 = local_1020;
      local_c68 = local_cc8;
      local_c70 = local_cc0;
      if (local_cc0 == (char *)0x0) {
        local_c54 = 0;
      }
      else {
        local_c54 = memcmp(local_1020,local_cc8,(size_t)local_cc0);
      }
      bVar2 = local_c54 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_cd8);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_1110,(char (*) [9])"vfp4-d16");
  local_1120 = "vfpv4-d16";
  local_d88.Length = strlen("vfpv4-d16");
  local_d78 = local_1110.super_StringRef.Data;
  local_d70 = (char *)local_1110.super_StringRef.Length;
  local_d88.Data = local_1120;
  local_d90 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_da0 = local_1020;
    local_d98 = local_1018;
    local_db0 = local_d78;
    local_da8 = local_d70;
    local_d58 = local_d78;
    local_d50 = local_d70;
    local_d68 = local_d78;
    local_d60 = local_d70;
    local_d30 = local_d78;
    local_d28 = local_d70;
    local_d38 = &local_d48;
    bVar2 = false;
    local_d48 = local_da0;
    local_d40 = local_d98;
    if (local_1018 == local_d70) {
      local_d10 = local_1020;
      local_d18 = local_d78;
      local_d20 = local_d70;
      if (local_d70 == (char *)0x0) {
        local_d04 = 0;
      }
      else {
        local_d04 = memcmp(local_1020,local_d78,(size_t)local_d70);
      }
      bVar2 = local_d04 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_d88);
    }
  }
  llvm::StringLiteral::StringLiteral<11UL>(&local_1130,(char (*) [11])"fp4-sp-d16");
  llvm::StringLiteral::StringLiteral<13UL>(&local_1140,(char (*) [13])"vfpv4-sp-d16");
  local_1150 = "fpv4-sp-d16";
  local_4f8 = strlen("fpv4-sp-d16");
  local_500 = local_1150;
  local_498 = local_1130.super_StringRef.Data;
  local_490 = (char *)local_1130.super_StringRef.Length;
  local_4a8 = local_1140.super_StringRef.Data;
  local_4a0 = (char *)local_1140.super_StringRef.Length;
  local_4c0 = local_1130.super_StringRef.Data;
  local_4b8 = (char *)local_1130.super_StringRef.Length;
  local_4d0 = local_1150;
  local_3a0 = local_1130.super_StringRef.Data;
  local_398 = (char *)local_1130.super_StringRef.Length;
  local_3b0.Data = local_1150;
  local_4c8 = local_4f8;
  local_4b0 = &local_1020;
  local_3b8 = &local_1020;
  local_3b0.Length = local_4f8;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_3c8 = local_1020;
    local_3c0 = local_1018;
    local_3d8 = local_3a0;
    local_3d0 = local_398;
    local_380 = local_3a0;
    local_378 = local_398;
    local_390 = local_3a0;
    local_388 = local_398;
    local_358 = local_3a0;
    local_350 = local_398;
    local_360 = &local_370;
    bVar2 = false;
    local_370 = local_3c8;
    local_368 = local_3c0;
    if (local_1018 == local_398) {
      local_338 = local_1020;
      local_340 = local_3a0;
      local_348 = local_398;
      if (local_398 == (char *)0x0) {
        local_32c = 0;
      }
      else {
        local_32c = memcmp(local_1020,local_3a0,(size_t)local_398);
      }
      bVar2 = local_32c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_3b0);
    }
  }
  local_4e0 = local_4a8;
  local_4d8 = local_4a0;
  local_4f0 = local_500;
  local_4e8 = local_4f8;
  local_450 = local_4a8;
  local_448 = local_4a0;
  local_460.Data = local_500;
  local_460.Length = local_4f8;
  local_468 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_478 = local_1020;
    local_470 = local_1018;
    local_488 = local_450;
    local_480 = local_448;
    local_430 = local_450;
    local_428 = local_448;
    local_440 = local_450;
    local_438 = local_448;
    local_408 = local_450;
    local_400 = local_448;
    local_410 = &local_420;
    bVar2 = false;
    local_420 = local_478;
    local_418 = local_470;
    if (local_1018 == local_448) {
      local_3e8 = local_1020;
      local_3f0 = local_450;
      local_3f8 = local_448;
      if (local_448 == (char *)0x0) {
        local_3dc = 0;
      }
      else {
        local_3dc = memcmp(local_1020,local_450,(size_t)local_448);
      }
      bVar2 = local_3dc == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_460);
    }
  }
  llvm::StringLiteral::StringLiteral<11UL>(&local_1160,(char (*) [11])"fp4-dp-d16");
  llvm::StringLiteral::StringLiteral<12UL>(&local_1170,(char (*) [12])"fpv4-dp-d16");
  local_1180 = "vfpv4-d16";
  local_6d0 = strlen("vfpv4-d16");
  local_6d8 = local_1180;
  local_670 = local_1160.super_StringRef.Data;
  local_668 = (char *)local_1160.super_StringRef.Length;
  local_680 = local_1170.super_StringRef.Data;
  local_678 = (char *)local_1170.super_StringRef.Length;
  local_698 = local_1160.super_StringRef.Data;
  local_690 = (char *)local_1160.super_StringRef.Length;
  local_6a8 = local_1180;
  local_578 = local_1160.super_StringRef.Data;
  local_570 = (char *)local_1160.super_StringRef.Length;
  local_588.Data = local_1180;
  local_6a0 = local_6d0;
  local_688 = &local_1020;
  local_590 = &local_1020;
  local_588.Length = local_6d0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_5a0 = local_1020;
    local_598 = local_1018;
    local_5b0 = local_578;
    local_5a8 = local_570;
    local_558 = local_578;
    local_550 = local_570;
    local_568 = local_578;
    local_560 = local_570;
    local_530 = local_578;
    local_528 = local_570;
    local_538 = &local_548;
    bVar2 = false;
    local_548 = local_5a0;
    local_540 = local_598;
    if (local_1018 == local_570) {
      local_510 = local_1020;
      local_518 = local_578;
      local_520 = local_570;
      if (local_570 == (char *)0x0) {
        local_504 = 0;
      }
      else {
        local_504 = memcmp(local_1020,local_578,(size_t)local_570);
      }
      bVar2 = local_504 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_588);
    }
  }
  local_6b8 = local_680;
  local_6b0 = local_678;
  local_6c8 = local_6d8;
  local_6c0 = local_6d0;
  local_628 = local_680;
  local_620 = local_678;
  local_638.Data = local_6d8;
  local_638.Length = local_6d0;
  local_640 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_650 = local_1020;
    local_648 = local_1018;
    local_660 = local_628;
    local_658 = local_620;
    local_608 = local_628;
    local_600 = local_620;
    local_618 = local_628;
    local_610 = local_620;
    local_5e0 = local_628;
    local_5d8 = local_620;
    local_5e8 = &local_5f8;
    bVar2 = false;
    local_5f8 = local_650;
    local_5f0 = local_648;
    if (local_1018 == local_620) {
      local_5c0 = local_1020;
      local_5c8 = local_628;
      local_5d0 = local_620;
      if (local_620 == (char *)0x0) {
        local_5b4 = 0;
      }
      else {
        local_5b4 = memcmp(local_1020,local_628,(size_t)local_620);
      }
      bVar2 = local_5b4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_638);
    }
  }
  llvm::StringLiteral::StringLiteral<11UL>(&local_1190,(char (*) [11])"fp5-sp-d16");
  local_11a0 = "fpv5-sp-d16";
  local_e38.Length = strlen("fpv5-sp-d16");
  local_e28 = local_1190.super_StringRef.Data;
  local_e20 = (char *)local_1190.super_StringRef.Length;
  local_e38.Data = local_11a0;
  local_e40 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_e50 = local_1020;
    local_e48 = local_1018;
    local_e60 = local_e28;
    local_e58 = local_e20;
    local_e08 = local_e28;
    local_e00 = local_e20;
    local_e18 = local_e28;
    local_e10 = local_e20;
    local_de0 = local_e28;
    local_dd8 = local_e20;
    local_de8 = &local_df8;
    bVar2 = false;
    local_df8 = local_e50;
    local_df0 = local_e48;
    if (local_1018 == local_e20) {
      local_dc0 = local_1020;
      local_dc8 = local_e28;
      local_dd0 = local_e20;
      if (local_e20 == (char *)0x0) {
        local_db4 = 0;
      }
      else {
        local_db4 = memcmp(local_1020,local_e28,(size_t)local_e20);
      }
      bVar2 = local_db4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_e38);
    }
  }
  llvm::StringLiteral::StringLiteral<11UL>(&local_11b0,(char (*) [11])"fp5-dp-d16");
  llvm::StringLiteral::StringLiteral<12UL>(&local_11c0,(char (*) [12])"fpv5-dp-d16");
  local_11d0 = "fpv5-d16";
  local_8a8 = strlen("fpv5-d16");
  local_8b0 = local_11d0;
  local_848 = local_11b0.super_StringRef.Data;
  local_840 = (char *)local_11b0.super_StringRef.Length;
  local_858 = local_11c0.super_StringRef.Data;
  local_850 = (char *)local_11c0.super_StringRef.Length;
  local_870 = local_11b0.super_StringRef.Data;
  local_868 = (char *)local_11b0.super_StringRef.Length;
  local_880 = local_11d0;
  local_750 = local_11b0.super_StringRef.Data;
  local_748 = (char *)local_11b0.super_StringRef.Length;
  local_760.Data = local_11d0;
  local_878 = local_8a8;
  local_860 = &local_1020;
  local_768 = &local_1020;
  local_760.Length = local_8a8;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_778 = local_1020;
    local_770 = local_1018;
    local_788 = local_750;
    local_780 = local_748;
    local_730 = local_750;
    local_728 = local_748;
    local_740 = local_750;
    local_738 = local_748;
    local_708 = local_750;
    local_700 = local_748;
    local_710 = &local_720;
    bVar2 = false;
    local_720 = local_778;
    local_718 = local_770;
    if (local_1018 == local_748) {
      local_6e8 = local_1020;
      local_6f0 = local_750;
      local_6f8 = local_748;
      if (local_748 == (char *)0x0) {
        local_6dc = 0;
      }
      else {
        local_6dc = memcmp(local_1020,local_750,(size_t)local_748);
      }
      bVar2 = local_6dc == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_760);
    }
  }
  local_890 = local_858;
  local_888 = local_850;
  local_8a0 = local_8b0;
  local_898 = local_8a8;
  local_800 = local_858;
  local_7f8 = local_850;
  local_810.Data = local_8b0;
  local_810.Length = local_8a8;
  local_818 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_828 = local_1020;
    local_820 = local_1018;
    local_838 = local_800;
    local_830 = local_7f8;
    local_7e0 = local_800;
    local_7d8 = local_7f8;
    local_7f0 = local_800;
    local_7e8 = local_7f8;
    local_7b8 = local_800;
    local_7b0 = local_7f8;
    local_7c0 = &local_7d0;
    bVar2 = false;
    local_7d0 = local_828;
    local_7c8 = local_820;
    if (local_1018 == local_7f8) {
      local_798 = local_1020;
      local_7a0 = local_800;
      local_7a8 = local_7f8;
      if (local_7f8 == (char *)0x0) {
        local_78c = 0;
      }
      else {
        local_78c = memcmp(local_1020,local_800,(size_t)local_7f8);
      }
      bVar2 = local_78c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_810);
    }
  }
  llvm::StringLiteral::StringLiteral<11UL>(&local_11e0,(char (*) [11])"neon-vfpv3");
  local_ee8.Length = strlen("neon");
  local_ed8 = local_11e0.super_StringRef.Data;
  local_ed0 = (char *)local_11e0.super_StringRef.Length;
  local_ee8.Data = "neon";
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (!bVar2) {
    local_ea8 = local_1020;
    local_ea0 = local_1018;
    local_eb8 = local_ed8;
    local_eb0 = local_ed0;
    local_ec8 = local_ed8;
    local_ec0 = local_ed0;
    local_e90 = local_ed8;
    local_e88 = local_ed0;
    local_e98 = &local_ea8;
    bVar2 = false;
    if (local_1018 == local_ed0) {
      local_e70 = local_1020;
      local_e78 = local_ed8;
      local_e80 = local_ed0;
      if (local_ed0 == (char *)0x0) {
        local_e64 = 0;
      }
      else {
        local_e64 = memcmp(local_1020,local_ed8,(size_t)local_ed0);
      }
      bVar2 = local_e64 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1010,&local_ee8);
    }
  }
  local_a38 = local_ff8;
  local_a30 = FPU_local.Data;
  local_a40 = &local_1020;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1010);
  if (bVar2) {
    pSVar3 = llvm::Optional<llvm::StringRef>::operator*(&OStack_1010);
    local_a28 = pSVar3->Data;
    local_a20 = (char *)pSVar3->Length;
  }
  else {
    local_a28 = local_a38;
    local_a20 = local_a30;
  }
  SVar1.Length = (size_t)local_a20;
  SVar1.Data = local_a28;
  return SVar1;
}

Assistant:

static StringRef getFPUSynonym(StringRef FPU) {
  return StringSwitch<StringRef>(FPU)
      .Cases("fpa", "fpe2", "fpe3", "maverick", "invalid") // Unsupported
      .Case("vfp2", "vfpv2")
      .Case("vfp3", "vfpv3")
      .Case("vfp4", "vfpv4")
      .Case("vfp3-d16", "vfpv3-d16")
      .Case("vfp4-d16", "vfpv4-d16")
      .Cases("fp4-sp-d16", "vfpv4-sp-d16", "fpv4-sp-d16")
      .Cases("fp4-dp-d16", "fpv4-dp-d16", "vfpv4-d16")
      .Case("fp5-sp-d16", "fpv5-sp-d16")
      .Cases("fp5-dp-d16", "fpv5-dp-d16", "fpv5-d16")
      // FIXME: Clang uses it, but it's bogus, since neon defaults to vfpv3.
      .Case("neon-vfpv3", "neon")
      .Default(FPU);
}